

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  int *piVar1;
  uint uVar2;
  sqlite3 *db;
  Db *pDVar3;
  Btree *pBVar4;
  Pager *pPVar5;
  char *pcVar6;
  Btree *pBVar7;
  Schema *pSVar8;
  u8 uVar9;
  undefined6 uVar10;
  u8 uVar11;
  u8 uVar12;
  undefined6 uVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  char *zRight;
  Db *pDVar17;
  Schema *pSVar18;
  Btree **ppBVar19;
  long lVar20;
  char *zErrDyn;
  uint flags;
  char *zErr;
  char *zPath;
  sqlite3_vfs *pVfs;
  char *local_70;
  sqlite3_context *local_68;
  uint local_5c;
  undefined8 local_58;
  char *local_50;
  char *local_48;
  sqlite3_context *local_40;
  sqlite3_vfs *local_38;
  
  db = context->pOut->db;
  iVar14 = 0;
  local_40 = (sqlite3_context *)0x0;
  local_48 = (char *)0x0;
  local_70 = (char *)0x0;
  pcVar16 = (char *)sqlite3ValueText(*argv,'\x01');
  zRight = (char *)sqlite3ValueText(argv[1],'\x01');
  if (pcVar16 == (char *)0x0) {
    pcVar16 = "";
  }
  if (zRight == (char *)0x0) {
    zRight = "";
  }
  uVar2 = db->nDb;
  local_50 = pcVar16;
  if ((int)uVar2 < db->aLimit[7] + 2) {
    pDVar17 = db->aDb;
    local_68 = context;
    if (0 < (int)uVar2) {
      lVar20 = 0;
      do {
        iVar14 = sqlite3StrICmp(*(char **)((long)&pDVar17->zDbSName + lVar20),zRight);
        if (iVar14 == 0) {
          iVar14 = 0;
          local_70 = sqlite3MPrintf(db,"database %s is already in use",zRight);
          context = local_68;
          goto LAB_001a793d;
        }
        lVar20 = lVar20 + 0x20;
      } while ((ulong)uVar2 << 5 != lVar20);
    }
    if (pDVar17 == db->aDbStatic) {
      pDVar17 = (Db *)sqlite3DbMallocRawNN(db,0x60);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
      pDVar3 = db->aDb;
      pcVar16 = pDVar3->zDbSName;
      pBVar4 = pDVar3->pBt;
      uVar11 = pDVar3->safety_level;
      uVar12 = pDVar3->bSyncSet;
      uVar13 = *(undefined6 *)&pDVar3->field_0x12;
      pSVar18 = pDVar3->pSchema;
      pcVar6 = pDVar3[1].zDbSName;
      pBVar7 = pDVar3[1].pBt;
      uVar9 = pDVar3[1].bSyncSet;
      uVar10 = *(undefined6 *)&pDVar3[1].field_0x12;
      pSVar8 = pDVar3[1].pSchema;
      pDVar17[1].safety_level = pDVar3[1].safety_level;
      pDVar17[1].bSyncSet = uVar9;
      *(undefined6 *)&pDVar17[1].field_0x12 = uVar10;
      pDVar17[1].pSchema = pSVar8;
      pDVar17[1].zDbSName = pcVar6;
      pDVar17[1].pBt = pBVar7;
      pDVar17->safety_level = uVar11;
      pDVar17->bSyncSet = uVar12;
      *(undefined6 *)&pDVar17->field_0x12 = uVar13;
      pDVar17->pSchema = pSVar18;
      pDVar17->zDbSName = pcVar16;
      pDVar17->pBt = pBVar4;
    }
    else {
      pDVar17 = (Db *)sqlite3DbRealloc(db,pDVar17,(long)(int)uVar2 * 0x20 + 0x20);
      if (pDVar17 == (Db *)0x0) {
        return;
      }
    }
    context = local_68;
    db->aDb = pDVar17;
    iVar14 = db->nDb;
    pDVar3 = pDVar17 + iVar14;
    pDVar3->safety_level = '\0';
    pDVar3->bSyncSet = '\0';
    *(undefined6 *)&pDVar3->field_0x12 = 0;
    *(Schema **)(&pDVar3->safety_level + 8) = (Schema *)0x0;
    pDVar17[iVar14].zDbSName = (char *)0x0;
    pDVar17[iVar14].pBt = (Btree *)0x0;
    local_5c = db->openFlags;
    iVar15 = sqlite3ParseUri(db->pVfs->zName,local_50,&local_5c,&local_38,(char **)&local_40,
                             &local_48);
    if (iVar15 != 0) {
      if (iVar15 == 7) {
        sqlite3OomFault(db);
      }
      pcVar16 = local_48;
      context->isError = 1;
      sqlite3VdbeMemSetStr
                (context->pOut,local_48,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar16);
      return;
    }
    pDVar17 = pDVar17 + iVar14;
    local_5c = local_5c | 0x100;
    ppBtree = &pDVar17->pBt;
    local_68 = local_40;
    ppBVar19 = ppBtree;
    iVar14 = sqlite3BtreeOpen(local_38,(char *)local_40,db,ppBtree,0,local_5c);
    db->nDb = db->nDb + 1;
    pcVar16 = sqlite3DbStrDup(db,zRight);
    pDVar17->zDbSName = pcVar16;
    db->noSharedCache = '\0';
    if (iVar14 == 0) {
      pSVar18 = sqlite3SchemaGet(db,pDVar17->pBt);
      pDVar17->pSchema = pSVar18;
      iVar14 = 0;
      if (pSVar18 == (Schema *)0x0) {
        iVar14 = 7;
        local_58 = 0;
      }
      else {
        local_58 = CONCAT71((int7)((ulong)ppBVar19 >> 8),1);
        if ((pSVar18->file_format != '\0') && (pSVar18->enc != db->enc)) {
          local_58 = 0;
          local_70 = sqlite3MPrintf(db,
                                    "attached databases must use the same text encoding as main database"
                                   );
          iVar14 = 1;
        }
      }
      sqlite3BtreeEnter(*ppBtree);
      pBVar4 = *ppBtree;
      pPVar5 = pBVar4->pBt->pPager;
      if (pPVar5->tempFile == '\0') {
        if ((pPVar5->pWal == (Wal *)0x0) || (pPVar5->pWal->exclusiveMode != '\x02')) {
          pPVar5->exclusiveMode = db->dfltLockMode;
        }
      }
      iVar15 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(pBVar4,iVar15);
      sqlite3BtreeSetPagerFlags(*ppBtree,(uint)db->flags & 0x38 | 3);
      pBVar4 = *ppBtree;
      if (pBVar4->sharable != '\0') {
        piVar1 = &pBVar4->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar4);
        }
      }
      pDVar17->safety_level = '\x03';
      if ((char)local_58 == '\0') goto LAB_001a7aed;
      if (pDVar17->zDbSName == (char *)0x0) {
        iVar14 = 7;
        goto LAB_001a7aed;
      }
      sqlite3_free(local_68);
      if (db->noSharedCache == '\0') {
        btreeEnterAll(db);
      }
      (db->init).iDb = '\0';
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
      iVar14 = sqlite3Init(db,&local_70);
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
      if (iVar14 == 0) {
        return;
      }
    }
    else {
      if (iVar14 == 0x13) {
        local_70 = sqlite3MPrintf(db,"database is already attached");
        iVar14 = 1;
      }
      pDVar17->safety_level = '\x03';
LAB_001a7aed:
      sqlite3_free(local_68);
    }
    lVar20 = (long)db->nDb + -1;
    pBVar4 = db->aDb[lVar20].pBt;
    if (pBVar4 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar4);
      pDVar17 = db->aDb;
      pDVar17[lVar20].pBt = (Btree *)0x0;
      pDVar17[lVar20].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar20;
    if ((iVar14 == 0xc0a) || (iVar14 == 7)) {
      sqlite3OomFault(db);
      if (local_70 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_70);
      }
      local_70 = sqlite3MPrintf(db,"out of memory");
      goto LAB_001a793d;
    }
    if (local_70 == (char *)0x0) {
      local_70 = sqlite3MPrintf(db,"unable to open database: %s",local_50);
      goto LAB_001a793d;
    }
  }
  else {
    local_70 = sqlite3MPrintf(db,"too many attached databases - max %d");
LAB_001a793d:
    if (local_70 == (char *)0x0) goto LAB_001a7978;
  }
  context->isError = 1;
  sqlite3VdbeMemSetStr(context->pOut,local_70,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  if (local_70 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_70);
  }
LAB_001a7978:
  if (iVar14 != 0) {
    sqlite3_result_error_code(context,iVar14);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifdef SQLITE_ENABLE_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      char *z = db->aDb[i].zDbSName;
      assert( z && zName );
      if( sqlite3StrICmp(z, zName)==0 ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }
  
    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));
  
    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from URI filename, or if none,
        ** use the key from the main database. */
        if( sqlite3CodecQueryParameters(db, zName, zPath)==0 ){
          sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
          if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
            rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
          }
        }
        break;
    }
  }
#endif
  sqlite3_free( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}